

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O3

pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> * __thiscall
docopt::Command::single_match
          (pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *__return_storage_ptr__,
          Command *this,PatternList *left)

{
  element_type *peVar1;
  pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *ppVar2;
  pointer __n;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  int iVar5;
  long lVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar7;
  unsigned_long uVar8;
  pointer psVar9;
  pointer __s1;
  bool bVar10;
  undefined1 local_a1;
  Command *local_a0;
  pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *local_98;
  pointer local_90;
  pointer local_88;
  undefined1 local_80 [24];
  undefined1 local_68 [17];
  undefined7 uStack_57;
  undefined8 uStack_50;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  __return_storage_ptr__->first = 0;
  (__return_storage_ptr__->second).
  super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->second).
  super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  psVar9 = (left->
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(left->
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)psVar9;
  local_98 = __return_storage_ptr__;
  if (lVar7 != 0) {
    lVar7 = lVar7 >> 4;
    uVar8 = 0;
    local_a0 = this;
    do {
      peVar1 = (psVar9->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((peVar1 != (element_type *)0x0) &&
         (lVar6 = __dynamic_cast(peVar1,&Pattern::typeinfo,&Argument::typeinfo,0), lVar6 != 0)) {
        iVar5 = (*(local_a0->super_Argument).super_LeafPattern.super_Pattern._vptr_Pattern[3])();
        lVar7 = *(long *)CONCAT44(extraout_var,iVar5);
        local_90 = (pointer)local_80;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,lVar7,((long *)CONCAT44(extraout_var,iVar5))[1] + lVar7);
        __n = local_88;
        local_80._16_4_ = 3;
        __s1 = local_90;
        if (local_90 == (pointer)local_80) {
          uStack_50 = local_80._8_8_;
          __s1 = (pointer)(local_68 + 0x10);
        }
        stack0xffffffffffffffa8 = (pointer)CONCAT71(local_80._1_7_,local_80[0]);
        local_68._8_8_ = local_88;
        local_88 = (pointer)0x0;
        local_80[0] = 0;
        local_68._0_8_ = __s1;
        if ((*(int *)(lVar6 + 0x28) == 3) && (__n == *(pointer *)(lVar6 + 0x38))) {
          if (__n == (pointer)0x0) {
            bVar10 = true;
            local_90 = (pointer)local_80;
          }
          else {
            local_90 = (pointer)local_80;
            iVar5 = bcmp(__s1,*(void **)(lVar6 + 0x30),(size_t)__n);
            bVar10 = iVar5 == 0;
          }
        }
        else {
          bVar10 = false;
          local_90 = (pointer)local_80;
        }
        if (__s1 != (pointer)(local_68 + 0x10)) {
          operator_delete(__s1,(ulong)((long)&(stack0xffffffffffffffa8->_M_dataplus)._M_p + 1));
        }
        if (local_90 != (pointer)local_80) {
          operator_delete(local_90,CONCAT71(local_80._1_7_,local_80[0]) + 1);
        }
        ppVar2 = local_98;
        if (!bVar10) {
          return local_98;
        }
        local_98->first = uVar8;
        iVar5 = (*(local_a0->super_Argument).super_LeafPattern.super_Pattern._vptr_Pattern[3])();
        local_80._16_4_ = 1;
        local_68[0] = 1;
        local_48 = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<docopt::Command,std::allocator<docopt::Command>,std::__cxx11::string_const&,docopt::value>
                  (a_Stack_40,(Command **)&local_48,(allocator<docopt::Command> *)&local_a1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var_00,iVar5),(value *)(local_80 + 0x10));
        _Var4._M_pi = a_Stack_40[0]._M_pi;
        peVar3 = local_48;
        local_48 = (element_type *)0x0;
        a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (ppVar2->second).super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = peVar3;
        (ppVar2->second).super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Var4._M_pi;
        if (local_80._16_4_ == 4) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_68);
          return local_98;
        }
        if (local_80._16_4_ != 3) {
          return local_98;
        }
        if ((pointer)local_68._0_8_ == (pointer)(local_68 + 0x10)) {
          return local_98;
        }
        operator_delete((void *)local_68._0_8_,
                        (ulong)((long)&(stack0xffffffffffffffa8->_M_dataplus)._M_p + 1));
        return local_98;
      }
      uVar8 = uVar8 + 1;
      psVar9 = psVar9 + 1;
    } while (lVar7 + (ulong)(lVar7 == 0) != uVar8);
  }
  return local_98;
}

Assistant:

inline std::pair<size_t, std::shared_ptr<LeafPattern>> Command::single_match(PatternList const& left) const
	{
		std::pair<size_t, std::shared_ptr<LeafPattern>> ret {};

		for(size_t i = 0, size = left.size(); i < size; ++i)
		{
			auto arg = dynamic_cast<Argument const*>(left[i].get());
			if (arg) {
				if (name() == arg->getValue()) {
					ret.first = i;
					ret.second = std::make_shared<Command>(name(), value{true});
				}
				break;
			}
		}

		return ret;
	}